

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::torrent::should_announce_dht(torrent *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  element_type *peVar4;
  session_settings *psVar5;
  torrent *this_local;
  
  if (((byte)this->field_0x5cc >> 5 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x45])();
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = is_i2p(this);
      if (bVar1) {
        psVar5 = settings(this);
        bVar1 = session_settings::get_bool(psVar5,0x8017);
        if (!bVar1) {
          return false;
        }
      }
      iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x49])();
      if (CONCAT44(extraout_var,iVar3) == 0) {
        this_local._7_1_ = false;
      }
      else {
        peVar4 = ::std::
                 __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->super_torrent_hot_members).m_torrent_file);
        bVar1 = torrent_info::is_valid(peVar4);
        if ((bVar1) && (((byte)this->field_0x5c0 >> 3 & 1) == 0)) {
          this_local._7_1_ = false;
        }
        else if ((*(uint *)&this->field_0x5dd >> 0x18 & 1) == 0) {
          this_local._7_1_ = false;
        }
        else if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1b & 1) == 0) {
          peVar4 = ::std::
                   __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&(this->super_torrent_hot_members).m_torrent_file);
          bVar1 = torrent_info::is_valid(peVar4);
          if (bVar1) {
            peVar4 = ::std::
                     __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&(this->super_torrent_hot_members).m_torrent_file);
            bVar1 = torrent_info::priv(peVar4);
            if (bVar1) {
              return false;
            }
          }
          bVar1 = tracker_list::empty(&this->m_trackers);
          if (bVar1) {
            this_local._7_1_ = true;
          }
          else {
            psVar5 = settings(this);
            bVar1 = session_settings::get_bool(psVar5,0x8004);
            if (bVar1) {
              bVar1 = tracker_list::any_verified(&this->m_trackers);
              this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
            }
            else {
              this_local._7_1_ = true;
            }
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool torrent::should_announce_dht() const
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_enable_dht) return false;
		if (!m_ses.announce_dht()) return false;

#if TORRENT_USE_I2P
		// i2p torrents don't announced on the DHT
		// unless we allow mixed swarms
		if (is_i2p() && !settings().get_bool(settings_pack::allow_i2p_mixed))
			return false;
#endif

		if (!m_ses.dht()) return false;
		if (m_torrent_file->is_valid() && !m_files_checked) return false;
		if (!m_announce_to_dht) return false;
		if (m_paused) return false;

		// don't announce private torrents
		if (m_torrent_file->is_valid() && m_torrent_file->priv()) return false;
		if (m_trackers.empty()) return true;
		if (!settings().get_bool(settings_pack::use_dht_as_fallback)) return true;

		return !m_trackers.any_verified();
	}